

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXBinaryTokenizer.cpp
# Opt level: O0

void Assimp::FBX::TokenizeBinary(TokenList *output_tokens,char *input,size_t length)

{
  bool bVar1;
  int iVar2;
  uint32_t uVar3;
  char *pcVar4;
  char *end;
  bool is64bits;
  char *pcStack_88;
  uint32_t version;
  char *cursor;
  string local_78;
  allocator<char> local_41;
  string local_40;
  size_t local_20;
  size_t length_local;
  char *input_local;
  TokenList *output_tokens_local;
  
  local_20 = length;
  length_local = (size_t)input;
  input_local = (char *)output_tokens;
  if (length < 0x1b) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"file is too short",&local_41);
    anon_unknown_3::TokenizeError(&local_40,0);
  }
  iVar2 = strncmp(input,"Kaydara FBX Binary",0x12);
  if (iVar2 == 0) {
    pcStack_88 = (char *)(length_local + 0x12);
    anon_unknown_3::ReadByte
              ((char *)length_local,&stack0xffffffffffffff78,(char *)(length_local + local_20));
    anon_unknown_3::ReadByte
              ((char *)length_local,&stack0xffffffffffffff78,(char *)(length_local + local_20));
    anon_unknown_3::ReadByte
              ((char *)length_local,&stack0xffffffffffffff78,(char *)(length_local + local_20));
    anon_unknown_3::ReadByte
              ((char *)length_local,&stack0xffffffffffffff78,(char *)(length_local + local_20));
    anon_unknown_3::ReadByte
              ((char *)length_local,&stack0xffffffffffffff78,(char *)(length_local + local_20));
    uVar3 = anon_unknown_3::ReadWord
                      ((char *)length_local,&stack0xffffffffffffff78,
                       (char *)(length_local + local_20));
    pcVar4 = (char *)(length_local + local_20);
    do {
      if (pcVar4 <= pcStack_88) {
        return;
      }
      bVar1 = anon_unknown_3::ReadScope
                        ((TokenList *)input_local,(char *)length_local,&stack0xffffffffffffff78,
                         (char *)(length_local + local_20),0x1d4b < uVar3);
    } while (bVar1);
    return;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"magic bytes not found",(allocator<char> *)((long)&cursor + 7));
  anon_unknown_3::TokenizeError(&local_78,0);
}

Assistant:

void TokenizeBinary(TokenList& output_tokens, const char* input, size_t length)
{
    ai_assert(input);

    if(length < 0x1b) {
        TokenizeError("file is too short",0);
    }

    //uint32_t offset = 0x15;
/*    const char* cursor = input + 0x15;

    const uint32_t flags = ReadWord(input, cursor, input + length);

    const uint8_t padding_0 = ReadByte(input, cursor, input + length); // unused
    const uint8_t padding_1 = ReadByte(input, cursor, input + length); // unused*/

    if (strncmp(input,"Kaydara FBX Binary",18)) {
        TokenizeError("magic bytes not found",0);
    }

    const char* cursor = input + 18;
	/*Result ignored*/ ReadByte(input, cursor, input + length);
	/*Result ignored*/ ReadByte(input, cursor, input + length);
	/*Result ignored*/ ReadByte(input, cursor, input + length);
	/*Result ignored*/ ReadByte(input, cursor, input + length);
	/*Result ignored*/ ReadByte(input, cursor, input + length);
	const uint32_t version = ReadWord(input, cursor, input + length);
	const bool is64bits = version >= 7500;
    const char *end = input + length;
    while (cursor < end ) {
		if (!ReadScope(output_tokens, input, cursor, input + length, is64bits)) {
            break;
        }
    }
}